

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_test.c
# Opt level: O1

void compare_reference_image_values
               (nifti_image *reference_image,nifti_image *reloaded_image,int *Errors)

{
  int iVar1;
  
  _PrintTest(0x78,"Checking nifti_type",
             (uint)(reference_image->nifti_type != reloaded_image->nifti_type),NIFTITEST_FALSE,
             Errors);
  iVar1 = strcmp(reference_image->fname,reloaded_image->fname);
  _PrintTest(0x79,"Checking fname",iVar1,NIFTITEST_FALSE,Errors);
  iVar1 = strcmp(reference_image->iname,reloaded_image->iname);
  _PrintTest(0x7a,"Checking iname",iVar1,NIFTITEST_FALSE,Errors);
  _PrintTest(0x7b,"Checking ndim",(uint)(reference_image->ndim != reloaded_image->ndim),
             NIFTITEST_FALSE,Errors);
  _PrintTest(0x7c,"Checking nx",(uint)(reference_image->nx != reloaded_image->nx),NIFTITEST_FALSE,
             Errors);
  _PrintTest(0x7d,"Checking ny",(uint)(reference_image->ny != reloaded_image->ny),NIFTITEST_FALSE,
             Errors);
  _PrintTest(0x7e,"Checking nz",(uint)(reference_image->nz != reloaded_image->nz),NIFTITEST_FALSE,
             Errors);
  _PrintTest(0x7f,"Checking nt",(uint)(reference_image->nt != reloaded_image->nt),NIFTITEST_FALSE,
             Errors);
  _PrintTest(0x80,"Checking nu",(uint)(reference_image->nu != reloaded_image->nu),NIFTITEST_FALSE,
             Errors);
  _PrintTest(0x81,"Checking dx",-(uint)(reloaded_image->dx != reference_image->dx) & 1,
             NIFTITEST_FALSE,Errors);
  _PrintTest(0x82,"Checking dy",-(uint)(reloaded_image->dy != reference_image->dy) & 1,
             NIFTITEST_FALSE,Errors);
  _PrintTest(0x83,"Checking dz",-(uint)(reloaded_image->dz != reference_image->dz) & 1,
             NIFTITEST_FALSE,Errors);
  _PrintTest(0x84,"Checking dt",-(uint)(reloaded_image->dt != reference_image->dt) & 1,
             NIFTITEST_FALSE,Errors);
  _PrintTest(0x85,"Checking du",-(uint)(reloaded_image->du != reference_image->du) & 1,
             NIFTITEST_FALSE,Errors);
  _PrintTest(0x86,"Checking datatype",(uint)(reference_image->datatype != reloaded_image->datatype),
             NIFTITEST_FALSE,Errors);
  _PrintTest(0x89,"Check loaded data is non null",(uint)(reloaded_image->data == (void *)0x0),
             NIFTITEST_TRUE,Errors);
  _PrintTest(0x8a,"Check reference_image data is non null",
             (uint)(reference_image->data == (void *)0x0),NIFTITEST_TRUE,Errors);
  _PrintTest(0x97,"Checking xyz_units",
             (uint)(reference_image->xyz_units != reloaded_image->xyz_units),NIFTITEST_FALSE,Errors)
  ;
  _PrintTest(0x98,"Checking time_units",
             (uint)(reference_image->time_units != reloaded_image->time_units),NIFTITEST_FALSE,
             Errors);
  _PrintTest(0x99,"Checking intent_code",
             (uint)(reference_image->intent_code != reloaded_image->intent_code),NIFTITEST_FALSE,
             Errors);
  iVar1 = strncmp(reference_image->intent_name,reloaded_image->intent_name,0x10);
  _PrintTest(0x9a,"Checking intent_name",(uint)(iVar1 != 0),NIFTITEST_FALSE,Errors);
  iVar1 = strncmp(reference_image->descrip,reloaded_image->descrip,0x50);
  _PrintTest(0x9b,"Checking description",(uint)(iVar1 != 0),NIFTITEST_FALSE,Errors);
  return;
}

Assistant:

void compare_reference_image_values(nifti_image const * const reference_image, nifti_image const * const reloaded_image, int * const Errors)
{
  PrintTest("Checking nifti_type",(reference_image->nifti_type!=reloaded_image->nifti_type),NIFTITEST_FALSE,Errors);
  PrintTest("Checking fname",(strcmp(reference_image->fname,reloaded_image->fname)),NIFTITEST_FALSE,Errors);
  PrintTest("Checking iname",(strcmp(reference_image->iname,reloaded_image->iname)),NIFTITEST_FALSE,Errors);
  PrintTest("Checking ndim",(reference_image->ndim!=reloaded_image->ndim),NIFTITEST_FALSE,Errors);
  PrintTest("Checking nx",(reference_image->nx!=reloaded_image->nx),NIFTITEST_FALSE,Errors);
  PrintTest("Checking ny",(reference_image->ny!=reloaded_image->ny),NIFTITEST_FALSE,Errors);
  PrintTest("Checking nz",(reference_image->nz!=reloaded_image->nz),NIFTITEST_FALSE,Errors);
  PrintTest("Checking nt",(reference_image->nt!=reloaded_image->nt),NIFTITEST_FALSE,Errors);
  PrintTest("Checking nu",(reference_image->nu!=reloaded_image->nu),NIFTITEST_FALSE,Errors);
  PrintTest("Checking dx",(reference_image->dx!=reloaded_image->dx),NIFTITEST_FALSE,Errors);
  PrintTest("Checking dy",(reference_image->dy!=reloaded_image->dy),NIFTITEST_FALSE,Errors);
  PrintTest("Checking dz",(reference_image->dz!=reloaded_image->dz),NIFTITEST_FALSE,Errors);
  PrintTest("Checking dt",(reference_image->dt!=reloaded_image->dt),NIFTITEST_FALSE,Errors);
  PrintTest("Checking du",(reference_image->du!=reloaded_image->du),NIFTITEST_FALSE,Errors);
  PrintTest("Checking datatype",(reference_image->datatype!=reloaded_image->datatype),NIFTITEST_FALSE,Errors);
  {
  const unsigned int NumVoxels=reference_image->nx*reference_image->ny*reference_image->nz*reference_image->nt*reference_image->nu;
  PrintTest("Check loaded data is non null",(reloaded_image->data==0),NIFTITEST_TRUE,Errors);
  PrintTest("Check reference_image data is non null",(reference_image->data==0),NIFTITEST_TRUE,Errors);
  {
  unsigned int CurrVoxel=0;
  for(; CurrVoxel < NumVoxels ; CurrVoxel++)
    {
    /*printf("%d ",CurrVoxel); fflush(stdout);*/
    if( ((int *)(reference_image->data))[CurrVoxel] !=  ((int *)(reloaded_image->data))[CurrVoxel])
      {
      PrintTest("Incorrect Pixel Value Found",0,NIFTITEST_FALSE,Errors);
      }
    }
  }
  }
  PrintTest("Checking xyz_units",(reference_image->xyz_units!=reloaded_image->xyz_units),NIFTITEST_FALSE,Errors);
  PrintTest("Checking time_units",(reference_image->time_units!=reloaded_image->time_units),NIFTITEST_FALSE,Errors);
  PrintTest("Checking intent_code",(reference_image->intent_code!=reloaded_image->intent_code),NIFTITEST_FALSE,Errors);
  PrintTest("Checking intent_name",(strncmp(reference_image->intent_name,reloaded_image->intent_name,16) )!=0,NIFTITEST_FALSE,Errors);
  PrintTest("Checking description",(strncmp(reference_image->descrip,reloaded_image->descrip,80))!=0,NIFTITEST_FALSE,Errors);
  return ;
}